

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O3

void __thiscall MipsGenerator::TranslateJUMP(MipsGenerator *this,Pcode *item)

{
  pointer pcVar1;
  int iVar2;
  string num1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58 [2];
  char local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (item->m_num1)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (item->m_num1)._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar2 == 0) {
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"jr $ra","");
    fprintf((FILE *)this->m_fp_mips,"%s\n",local_58[0]);
    local_38._M_dataplus._M_p = local_58[0];
    if (local_58[0] == local_48) goto LAB_0015b50a;
  }
  else {
    std::operator+(&local_38,"j ",&local_78);
    fprintf((FILE *)this->m_fp_mips,"%s\n",local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_0015b50a;
  }
  operator_delete(local_38._M_dataplus._M_p);
LAB_0015b50a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MipsGenerator::TranslateJUMP(Pcode& item) {
    string num1 = item.GetNum1();
    if (num1 == "RA") {
        Output2File("jr $ra");
    } else {
        Output2File("j " + num1);
    }
}